

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

TreeEnsembleParameters_TreeNode *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::TreeEnsembleParameters_TreeNode>(Arena *arena)

{
  TreeEnsembleParameters_TreeNode *this;
  
  if (arena == (Arena *)0x0) {
    this = (TreeEnsembleParameters_TreeNode *)operator_new(0x70);
    CoreML::Specification::TreeEnsembleParameters_TreeNode::TreeEnsembleParameters_TreeNode
              (this,(Arena *)0x0,false);
  }
  else {
    this = (TreeEnsembleParameters_TreeNode *)
           AllocateAlignedWithHook
                     (arena,0x70,
                      (type_info *)&CoreML::Specification::TreeEnsembleParameters_TreeNode::typeinfo
                     );
    CoreML::Specification::TreeEnsembleParameters_TreeNode::TreeEnsembleParameters_TreeNode
              (this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }